

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void clamp_mv2(MV *mv,MACROBLOCKD *xd)

{
  long in_RSI;
  SubpelMvLimits mv_limits;
  SubpelMvLimits *in_stack_ffffffffffffffd8;
  
  clamp_mv((MV *)CONCAT44(*(int *)(in_RSI + 0x1ef8) + 0x8e0,*(int *)(in_RSI + 0x1ef4) + -0x8e0),
           in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static inline void clamp_mv2(MV *mv, const MACROBLOCKD *xd) {
  const SubpelMvLimits mv_limits = { xd->mb_to_left_edge - LEFT_TOP_MARGIN,
                                     xd->mb_to_right_edge + RIGHT_BOTTOM_MARGIN,
                                     xd->mb_to_top_edge - LEFT_TOP_MARGIN,
                                     xd->mb_to_bottom_edge +
                                         RIGHT_BOTTOM_MARGIN };
  clamp_mv(mv, &mv_limits);
}